

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall SQCompilation::CheckerVisitor::visitTerExpr(CheckerVisitor *this,TerExpr *expr)

{
  pointer *ppSVar1;
  VarScope *this_00;
  int iVar2;
  undefined4 extraout_var;
  VarScope *elseScope;
  StackSlot local_38;
  VarScope *thenScope;
  undefined4 extraout_var_00;
  
  checkTernaryPriority(this,expr);
  checkSameValues(this,expr);
  checkAlwaysTrueOrFalse(this,expr);
  checkCanBeSimplified(this,expr);
  local_38.sst = SST_NODE;
  local_38.field_1 = (anon_union_8_2_108c9717_for_StackSlot_1)expr;
  std::
  vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
  ::emplace_back<SQCompilation::CheckerVisitor::StackSlot>(&this->nodeStack,&local_38);
  Node::visit<SQCompilation::CheckerVisitor>(&expr->_a->super_Node,this);
  this_00 = this->currentScope;
  iVar2 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  thenScope = (VarScope *)CONCAT44(extraout_var,iVar2);
  iVar2 = VarScope::copy(this_00,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
  elseScope = (VarScope *)CONCAT44(extraout_var_00,iVar2);
  speculateIfConditionHeuristics(this,expr->_a,thenScope,elseScope,false);
  this->currentScope = thenScope;
  Node::visit<SQCompilation::CheckerVisitor>(&expr->_b->super_Node,this);
  this->currentScope = elseScope;
  Node::visit<SQCompilation::CheckerVisitor>(&expr->_c->super_Node,this);
  ppSVar1 = &(this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppSVar1 = *ppSVar1 + -1;
  VarScope::merge(thenScope,elseScope);
  VarScope::copyFrom(this_00,thenScope);
  VarScope::~VarScope(thenScope);
  VarScope::~VarScope(elseScope);
  this->currentScope = this_00;
  return;
}

Assistant:

void CheckerVisitor::visitTerExpr(TerExpr *expr) {
  checkTernaryPriority(expr);
  checkSameValues(expr);
  checkAlwaysTrueOrFalse(expr);
  checkCanBeSimplified(expr);

  nodeStack.push_back({ SST_NODE, expr });

  expr->a()->visit(this);

  VarScope *trunkScope = currentScope;

  VarScope *ifTrueScope = trunkScope->copy(arena);
  VarScope *ifFalseScope = trunkScope->copy(arena);

  speculateIfConditionHeuristics(expr->a(), ifTrueScope, ifFalseScope);

  currentScope = ifTrueScope;
  expr->b()->visit(this);

  currentScope = ifFalseScope;
  expr->c()->visit(this);

  nodeStack.pop_back();

  ifTrueScope->merge(ifFalseScope);

  trunkScope->copyFrom(ifTrueScope);

  ifTrueScope->~VarScope();
  ifFalseScope->~VarScope();

  currentScope = trunkScope;
}